

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqastcodegen.cpp
# Opt level: O0

void __thiscall
SQCompilation::CodegenVisitor::emitAssign(CodegenVisitor *this,Expr *lvalue,Expr *rvalue)

{
  bool bVar1;
  TreeOp TVar2;
  FieldAccessExpr *this_00;
  SQInteger SVar3;
  SQChar *pSVar4;
  SQFuncState *this_01;
  SQInteger arg3;
  AccessExpr *pAVar5;
  Node *pNVar6;
  Node *in_RSI;
  CodegenVisitor *in_RDI;
  SQInteger src_1;
  SQInteger dst;
  SQInteger src;
  SQInteger pos;
  bool assignable;
  SQObjectPtr nameObj_1;
  Id *id;
  SQInteger constantI;
  SQObject nameObj;
  FieldAccessExpr *fieldAccess;
  Node *in_stack_fffffffffffffee8;
  SQFuncState *in_stack_fffffffffffffef0;
  SQFuncState *in_stack_fffffffffffffef8;
  SQFuncState *in_stack_ffffffffffffff00;
  SQFuncState *in_stack_ffffffffffffff08;
  SQInteger in_stack_ffffffffffffff10;
  undefined8 in_stack_ffffffffffffff18;
  SQOpcode SVar7;
  SQFuncState *in_stack_ffffffffffffff20;
  SQInteger in_stack_ffffffffffffff28;
  SQChar *in_stack_ffffffffffffff30;
  SQFuncState *in_stack_ffffffffffffff38;
  int max_const_no;
  SQFuncState *in_stack_ffffffffffffff68;
  SQObject local_60;
  SQObjectPtr local_50;
  Id *local_40;
  bool *in_stack_ffffffffffffffc8;
  undefined1 in_stack_ffffffffffffffd0 [16];
  
  SVar7 = (SQOpcode)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  bVar1 = Expr::isAccessExpr((Expr *)in_stack_fffffffffffffef0);
  if (bVar1) {
    pAVar5 = Expr::asAccessExpr((Expr *)in_RSI);
    pNVar6 = &AccessExpr::receiver(pAVar5)->super_Node;
    TVar2 = Node::op(pNVar6);
    if (TVar2 != TO_BASE) {
      Expr::asAccessExpr((Expr *)in_RSI);
      bVar1 = canBeLiteral((CodegenVisitor *)in_stack_ffffffffffffff08,
                           (AccessExpr *)in_stack_ffffffffffffff00);
      if (bVar1) {
        pAVar5 = Expr::asAccessExpr((Expr *)in_RSI);
        this_00 = AccessExpr::asFieldAccessExpr(pAVar5);
        max_const_no = (int)((ulong)((SQObjectValue *)&in_RDI->_fs)->nInteger >> 0x20);
        FieldAccessExpr::fieldName(this_00);
        SQFuncState::CreateString
                  (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
        SQFuncState::GetConstant(in_stack_ffffffffffffff68,(SQObject *)in_RDI,max_const_no);
        AccessExpr::receiver(&this_00->super_AccessExpr);
        visitForceGet((CodegenVisitor *)in_stack_ffffffffffffff00,(Node *)in_stack_fffffffffffffef8)
        ;
        visitForceGet((CodegenVisitor *)in_stack_ffffffffffffff00,(Node *)in_stack_fffffffffffffef8)
        ;
        emitFieldAssign((CodegenVisitor *)in_stack_ffffffffffffff20,SVar7);
        return;
      }
    }
  }
  visitNoGet((CodegenVisitor *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8);
  visitForceGet((CodegenVisitor *)in_stack_ffffffffffffff00,(Node *)in_stack_fffffffffffffef8);
  TVar2 = Node::op(in_RSI);
  if (TVar2 == TO_ID) {
    local_40 = Node::asId(in_RSI);
    Id::id(local_40);
    local_60 = SQFuncState::CreateString
                         (in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                          in_stack_ffffffffffffff28);
    ::SQObjectPtr::SQObjectPtr(&local_50,&local_60);
    SVar3 = SQFuncState::GetLocalVariable
                      (in_stack_ffffffffffffff08,(SQObject *)in_stack_ffffffffffffff00,
                       (bool *)in_stack_fffffffffffffef8);
    if (SVar3 == -1) {
      SVar3 = SQFuncState::GetOuterVariable
                        (in_stack_ffffffffffffffd0._8_8_,in_stack_ffffffffffffffd0._0_8_,
                         in_stack_ffffffffffffffc8);
      if (SVar3 == -1) {
        reportDiagnostic(in_RDI,in_RSI,0x27);
      }
      else {
        pSVar4 = Id::id(local_40);
        SVar7 = (SQOpcode)((ulong)SVar3 >> 0x20);
        reportDiagnostic(in_RDI,in_RSI,0x29,pSVar4);
        SVar3 = SQFuncState::PopTarget(in_stack_ffffffffffffff00);
        in_stack_fffffffffffffef0 = in_RDI->_fs;
        arg3 = SQFuncState::PushTarget
                         (in_stack_fffffffffffffef8,(SQInteger)in_stack_fffffffffffffef0);
        SQFuncState::AddInstruction
                  (in_stack_ffffffffffffff20,SVar7,(SQInteger)pSVar4,(SQInteger)in_RSI,SVar3,arg3);
      }
    }
    else {
      pSVar4 = Id::id(local_40);
      reportDiagnostic(in_RDI,in_RSI,0x29,pSVar4);
      SQFuncState::PopTarget(in_stack_ffffffffffffff00);
      this_01 = (SQFuncState *)SQFuncState::TopTarget((SQFuncState *)0x1c8d4d);
      SQFuncState::AddInstruction
                (this_01,SVar7,in_stack_ffffffffffffff10,(SQInteger)in_stack_ffffffffffffff08,
                 (SQInteger)in_stack_ffffffffffffff00,(SQInteger)in_stack_fffffffffffffef8);
    }
    ::SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffef0);
  }
  else {
    bVar1 = Expr::isAccessExpr((Expr *)in_stack_fffffffffffffef0);
    if (bVar1) {
      pAVar5 = Expr::asAccessExpr((Expr *)in_RSI);
      pNVar6 = &AccessExpr::receiver(pAVar5)->super_Node;
      TVar2 = Node::op(pNVar6);
      if (TVar2 == TO_BASE) {
        reportDiagnostic(in_RDI,in_RSI,0x27);
      }
      else {
        emitFieldAssign((CodegenVisitor *)in_stack_ffffffffffffff20,SVar7);
      }
    }
    else {
      reportDiagnostic(in_RDI,in_RSI,0x27);
    }
  }
  return;
}

Assistant:

void CodegenVisitor::emitAssign(Expr *lvalue, Expr * rvalue) {

    if (lvalue->isAccessExpr() && lvalue->asAccessExpr()->receiver()->op() != TO_BASE && canBeLiteral(lvalue->asAccessExpr())) {
        FieldAccessExpr *fieldAccess = lvalue->asAccessExpr()->asFieldAccessExpr();
        SQObject nameObj = _fs->CreateString(fieldAccess->fieldName());
        SQInteger constantI = _fs->GetConstant(nameObj);
        // arg1 is of int size, enough
        visitForceGet(fieldAccess->receiver());

        visitForceGet(rvalue);

        emitFieldAssign(constantI);
        return;
    }

    visitNoGet(lvalue);

    visitForceGet(rvalue);

    if (lvalue->op() == TO_ID) {
        Id *id = lvalue->asId();

        SQObjectPtr nameObj = _fs->CreateString(id->id());
        bool assignable = false;
        SQInteger pos = -1;

        if ((pos = _fs->GetLocalVariable(nameObj, assignable)) != -1) {
            if (!assignable)
                reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_BINDING, id->id());

            SQInteger src = _fs->PopTarget();
            SQInteger dst = _fs->TopTarget();
            _fs->AddInstruction(_OP_MOVE, dst, src);
        }
        else if ((pos = _fs->GetOuterVariable(nameObj, assignable)) != -1) {
            if (!assignable)
                reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_BINDING, id->id());

            SQInteger src = _fs->PopTarget();
            _fs->AddInstruction(_OP_SETOUTER, _fs->PushTarget(), pos, src);
        }
        else {
            reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
        }
    }
    else if (lvalue->isAccessExpr()) {
        if (lvalue->asAccessExpr()->receiver()->op() != TO_BASE) {
            emitFieldAssign(-1);
        }
        else {
            reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
        }
    }
    else {
        reportDiagnostic(lvalue, DiagnosticsId::DI_ASSIGN_TO_EXPR);
    }
}